

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# home.cpp
# Opt level: O0

string * fs_get_profile_dir_abi_cxx11_(void)

{
  string *in_RDI;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  passwd *local_28;
  passwd *pw;
  error_code ec;
  
  std::error_code::error_code((error_code *)&pw);
  local_28 = fs_getpwuid();
  if (local_28 == (passwd *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,"fs_get_profile_dir");
    fs_print_error(local_48,local_58,(error_code *)&pw);
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,local_28->pw_dir);
    fs_drop_slash_abi_cxx11_(in_RDI,local_38);
  }
  return in_RDI;
}

Assistant:

std::string fs_get_profile_dir()
{
  // has no trailing slash

  std::error_code ec;

#if defined(_WIN32)
  // https://learn.microsoft.com/en-us/windows/win32/api/userenv/nf-userenv-getuserprofiledirectorya
  std::string path(fs_get_max_path(), '\0');
  // works on MSYS2, MSVC, oneAPI
  HANDLE h = nullptr;
  auto N = static_cast<DWORD>(path.size());

  const bool ok = OpenProcessToken( GetCurrentProcess(), TOKEN_QUERY, &h) != 0 &&
    GetUserProfileDirectoryA(h, path.data(), &N);

  if(CloseHandle(h) && ok && N > 0) {
    path.resize(N - 1);
    return fs_drop_slash(path);
  }
#else
  if (auto pw = fs_getpwuid())
    return fs_drop_slash(pw->pw_dir);
#endif

  fs_print_error("", __func__, ec);
  return {};
}